

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examine_stack.cc
# Opt level: O0

void absl::debugging_internal::DumpStackTrace
               (int min_dropped_frames,int max_num_frames,bool symbolize_stacktrace,
               OutputWriter *writer,void *writer_arg)

{
  int iVar1;
  void ***pppvVar2;
  SymbolizeUrlEmitter p_Var3;
  SymbolizeUrlEmitter hook;
  int i;
  int depth;
  void *p;
  size_t needed_bytes;
  size_t allocated_bytes;
  void ***pppvStack_230;
  int num_stack;
  void **stack;
  void *stack_buf [64];
  void *writer_arg_local;
  OutputWriter *writer_local;
  bool symbolize_stacktrace_local;
  int max_num_frames_local;
  int min_dropped_frames_local;
  
  pppvStack_230 = &stack;
  allocated_bytes._4_4_ = 0x40;
  needed_bytes = 0;
  iVar1 = max_num_frames;
  stack_buf[0x3f] = writer_arg;
  if (0x40 < max_num_frames) {
    pppvVar2 = (void ***)anon_unknown_0::Allocate((long)max_num_frames << 3);
    iVar1 = allocated_bytes._4_4_;
    if (pppvVar2 != (void ***)0x0) {
      needed_bytes = (long)max_num_frames << 3;
      iVar1 = max_num_frames;
      pppvStack_230 = pppvVar2;
    }
  }
  allocated_bytes._4_4_ = iVar1;
  iVar1 = GetStackTrace(pppvStack_230,allocated_bytes._4_4_,min_dropped_frames + 1);
  for (hook._0_4_ = 0; (int)hook < iVar1; hook._0_4_ = (int)hook + 1) {
    if (symbolize_stacktrace) {
      anon_unknown_0::DumpPCAndSymbol(writer,stack_buf[0x3f],pppvStack_230[(int)hook],"    ");
    }
    else {
      anon_unknown_0::DumpPC(writer,stack_buf[0x3f],pppvStack_230[(int)hook],"    ");
    }
  }
  p_Var3 = GetDebugStackTraceHook();
  if (p_Var3 != (SymbolizeUrlEmitter)0x0) {
    (*p_Var3)(pppvStack_230,iVar1,writer,stack_buf[0x3f]);
  }
  if (needed_bytes != 0) {
    anon_unknown_0::Deallocate(pppvStack_230,needed_bytes);
  }
  return;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE
void DumpStackTrace(int min_dropped_frames, int max_num_frames,
                    bool symbolize_stacktrace, OutputWriter* writer,
                    void* writer_arg) {
  // Print stack trace
  void* stack_buf[kDefaultDumpStackFramesLimit];
  void** stack = stack_buf;
  int num_stack = kDefaultDumpStackFramesLimit;
  size_t allocated_bytes = 0;

  if (num_stack >= max_num_frames) {
    // User requested fewer frames than we already have space for.
    num_stack = max_num_frames;
  } else {
    const size_t needed_bytes =
        static_cast<size_t>(max_num_frames) * sizeof(stack[0]);
    void* p = Allocate(needed_bytes);
    if (p != nullptr) {  // We got the space.
      num_stack = max_num_frames;
      stack = reinterpret_cast<void**>(p);
      allocated_bytes = needed_bytes;
    }
  }

  int depth = absl::GetStackTrace(stack, num_stack, min_dropped_frames + 1);
  for (int i = 0; i < depth; i++) {
    if (symbolize_stacktrace) {
      DumpPCAndSymbol(writer, writer_arg, stack[static_cast<size_t>(i)],
                      "    ");
    } else {
      DumpPC(writer, writer_arg, stack[static_cast<size_t>(i)], "    ");
    }
  }

  auto hook = GetDebugStackTraceHook();
  if (hook != nullptr) {
    (*hook)(stack, depth, writer, writer_arg);
  }

  if (allocated_bytes != 0) Deallocate(stack, allocated_bytes);
}